

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O0

int ThreadPoolGetAttr(ThreadPool *tp,ThreadPoolAttr *out)

{
  ThreadPoolAttr *out_local;
  ThreadPool *tp_local;
  
  if ((tp == (ThreadPool *)0x0) || (out == (ThreadPoolAttr *)0x0)) {
    tp_local._4_4_ = 0x16;
  }
  else {
    if (tp->shutdown == 0) {
      pthread_mutex_lock((pthread_mutex_t *)tp);
    }
    memcpy(out,&tp->attr,0x28);
    if (tp->shutdown == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)tp);
    }
    tp_local._4_4_ = 0;
  }
  return tp_local._4_4_;
}

Assistant:

int ThreadPoolGetAttr(ThreadPool *tp, ThreadPoolAttr *out)
{
	if (!tp || !out)
		return EINVAL;
	if (!tp->shutdown)
		ithread_mutex_lock(&tp->mutex);
	*out = tp->attr;
	if (!tp->shutdown)
		ithread_mutex_unlock(&tp->mutex);

	return 0;
}